

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O3

Matrix<double,__1,_1,_0,__1,_1> __thiscall
lf::assemble::COOMatrix<double>::MatVecMult<Eigen::Matrix<double,_1,1,0,_1,1>>
          (COOMatrix<double> *this,double alpha,Matrix<double,__1,_1,_0,__1,_1> *vec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pTVar3;
  long lVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  CoeffReturnType pdVar8;
  Scalar *pSVar9;
  ostream *poVar10;
  undefined1 *puVar11;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RDX;
  long extraout_RDX;
  ulong uVar12;
  long lVar13;
  long extraout_RDX_00;
  Triplet *trp;
  double *pdVar14;
  ActualDstType actualDst;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Matrix<double,__1,_1,_0,__1,_1> MVar17;
  stringstream ss;
  string local_220;
  string local_200;
  string local_1e0;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  undefined1 local_1a8 [16];
  scalar_constant_op<double> local_198;
  
  local_1c0 = alpha;
  if ((long)(ulong)*(uint *)((long)&(vec->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data + 4) <= *(long *)(in_RDX + 8)) {
    this->rows_ = 0;
    this->cols_ = 0;
    (this->triplets_).
    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
               (ulong)*(uint *)&(vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                ).m_storage.m_data);
    local_220._M_dataplus._M_p = (pointer)0x0;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_1a8,
                     (Index)(this->triplets_).
                            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,1,
                     (scalar_constant_op<double> *)&local_220);
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
              ((Matrix<double,__1,_1,_0,__1,_1> *)this,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)local_1a8,(assign_op<double,_double> *)&local_220);
    auVar7 = _DAT_0046a0a0;
    auVar6 = _DAT_0046a090;
    pTVar3 = (this->triplets_).
             super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = extraout_RDX;
    if (0 < (long)pTVar3) {
      lVar4 = *(long *)this;
      puVar11 = (undefined1 *)((long)&pTVar3[0x1ffffffffffffff].m_value + 7);
      uVar12 = (ulong)puVar11 & 0x1fffffffffffffff;
      auVar15._8_4_ = (int)uVar12;
      auVar15._0_8_ = uVar12;
      auVar15._12_4_ = (int)(uVar12 >> 0x20);
      lVar13 = 0;
      auVar15 = auVar15 ^ _DAT_0046a0a0;
      do {
        auVar16._8_4_ = (int)lVar13;
        auVar16._0_8_ = lVar13;
        auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar16 = (auVar16 | auVar6) ^ auVar7;
        if ((bool)(~(auVar16._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar16._0_4_ ||
                    auVar15._4_4_ < auVar16._4_4_) & 1)) {
          *(double *)(lVar4 + lVar13 * 8) = local_198.m_other;
        }
        if ((auVar16._12_4_ != auVar15._12_4_ || auVar16._8_4_ <= auVar15._8_4_) &&
            auVar16._12_4_ <= auVar15._12_4_) {
          *(double *)(lVar4 + 8 + lVar13 * 8) = local_198.m_other;
        }
        lVar13 = lVar13 + 2;
      } while ((uVar12 - ((uint)puVar11 & 1)) + 2 != lVar13);
    }
    pdVar5 = vec[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    for (pdVar14 = (double *)
                   (vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows; pdVar14 != pdVar5; pdVar14 = pdVar14 + 2) {
      local_1b0 = pdVar14[1];
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         (in_RDX,(long)*(int *)((long)pdVar14 + 4));
      local_1b8 = *pdVar8;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                          (long)*(int *)pdVar14);
      *pSVar9 = local_1b0 * local_1b8 * local_1c0 + *pSVar9;
      lVar13 = extraout_RDX_00;
    }
    MVar17.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = lVar13;
    MVar17.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (Matrix<double,__1,_1,_0,__1,_1>)
           MVar17.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"size mismatch: ",0xf);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," <-> ",5);
  std::ostream::_M_insert<long>((long)poVar10);
  paVar1 = &local_220.field_2;
  local_220._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"vec.size() >= cols_","");
  paVar2 = &local_200.field_2;
  local_200._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_220,&local_200,0xef,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar1) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  local_220._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"false","");
  local_200._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,"");
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
  base::AssertionFailed(&local_220,&local_200,0xef,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  abort();
}

Assistant:

Eigen::Matrix<SCALAR, Eigen::Dynamic, 1> COOMatrix<SCALAR>::MatVecMult(
    SCALAR alpha, const VECTOR &vec) const {
  LF_ASSERT_MSG(vec.size() >= cols_,
                "size mismatch: " << cols_ << " <-> " << vec.size());
  Eigen::VectorXd result(rows_);
  result.setZero();
  for (const Triplet &trp : triplets_) {
    result[trp.row()] += trp.value() * (alpha * vec[trp.col()]);
  }
  return result;
}